

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ed25519.cc
# Opt level: O0

int pkey_ed25519_sign_message
              (EVP_PKEY_CTX *ctx,uint8_t *sig,size_t *siglen,uint8_t *tbs,size_t tbslen)

{
  uint8_t *private_key;
  int iVar1;
  ED25519_KEY *key;
  size_t tbslen_local;
  uint8_t *tbs_local;
  size_t *siglen_local;
  uint8_t *sig_local;
  EVP_PKEY_CTX *ctx_local;
  
  private_key = (uint8_t *)ctx->pkey->pkey;
  if (private_key[0x40] == '\0') {
    ERR_put_error(6,0,0x82,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ed25519.cc"
                  ,0x33);
    ctx_local._4_4_ = 0;
  }
  else if (sig == (uint8_t *)0x0) {
    *siglen = 0x40;
    ctx_local._4_4_ = 1;
  }
  else if (*siglen < 0x40) {
    ERR_put_error(6,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ed25519.cc"
                  ,0x3d);
    ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = ED25519_sign(sig,tbs,tbslen,private_key);
    if (iVar1 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      *siglen = 0x40;
      ctx_local._4_4_ = 1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int pkey_ed25519_sign_message(EVP_PKEY_CTX *ctx, uint8_t *sig,
                                     size_t *siglen, const uint8_t *tbs,
                                     size_t tbslen) {
  const ED25519_KEY *key =
      reinterpret_cast<const ED25519_KEY *>(ctx->pkey->pkey);
  if (!key->has_private) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_NOT_A_PRIVATE_KEY);
    return 0;
  }

  if (sig == NULL) {
    *siglen = 64;
    return 1;
  }

  if (*siglen < 64) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_BUFFER_TOO_SMALL);
    return 0;
  }

  if (!ED25519_sign(sig, tbs, tbslen, key->key)) {
    return 0;
  }

  *siglen = 64;
  return 1;
}